

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void msa_sld_df(uint32_t df,wr_t *pwd,wr_t *pws,target_ulong rt)

{
  uint uVar1;
  long lVar2;
  wr_t *pwVar3;
  long lVar4;
  bool bVar5;
  uint8_t v [64];
  undefined8 local_48;
  int64_t iStack_40;
  int64_t local_38;
  int64_t iStack_30;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x1276,"void msa_sld_df(uint32_t, wr_t *, wr_t *, target_ulong)");
  }
  uVar1 = (int)(0x80L >> ((char)df + 3U & 0x3f)) - 1U & (uint)rt;
  switch(df) {
  case 0:
    local_48 = pws->d[0];
    iStack_40 = pws->d[1];
    local_38 = pwd->d[0];
    iStack_30 = pwd->d[1];
    lVar2 = 0;
    do {
      pwd->b[lVar2] = *(int8_t *)((long)&local_48 + (ulong)(uVar1 + (int)lVar2));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    break;
  case 1:
    lVar2 = 0;
    pwVar3 = pwd;
    do {
      local_48 = pws->d[lVar2];
      iStack_40 = pwd->d[lVar2];
      lVar4 = 0;
      do {
        pwVar3->b[lVar4] = *(int8_t *)((long)&local_48 + (ulong)(uVar1 + (int)lVar4));
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      pwVar3 = (wr_t *)(pwVar3->b + 8);
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    break;
  case 2:
    lVar2 = 0;
    pwVar3 = pwd;
    do {
      local_48 = CONCAT44(pwd->w[lVar2],pws->w[lVar2]);
      lVar4 = 0;
      do {
        pwVar3->b[lVar4] = *(int8_t *)((long)&local_48 + (ulong)(uVar1 + (int)lVar4));
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      lVar2 = lVar2 + 1;
      pwVar3 = (wr_t *)(pwVar3->b + 4);
    } while (lVar2 != 4);
    break;
  case 3:
    lVar2 = 0;
    pwVar3 = pwd;
    do {
      local_48._0_4_ = CONCAT22(pwd->h[lVar2],pws->h[lVar2]);
      lVar4 = 0;
      do {
        pwVar3->b[lVar4] = *(int8_t *)((long)&local_48 + (ulong)(uVar1 + (int)lVar4));
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      lVar2 = lVar2 + 1;
      pwVar3 = (wr_t *)(pwVar3->b + 2);
    } while (lVar2 != 8);
  }
  return;
}

Assistant:

static inline void msa_sld_df(uint32_t df, wr_t *pwd,
                              wr_t *pws, target_ulong rt)
{
    uint32_t n = rt % DF_ELEMENTS(df);
    uint8_t v[64];
    uint32_t i, k;

    switch (df) {
    case DF_BYTE:
        CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_BYTE), 0);
        break;
    case DF_HALF:
        for (k = 0; k < 2; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_HALF), k);
        }
        break;
    case DF_WORD:
        for (k = 0; k < 4; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_WORD), k);
        }
        break;
    case DF_DOUBLE:
        for (k = 0; k < 8; k++) {
            CONCATENATE_AND_SLIDE(DF_ELEMENTS(DF_DOUBLE), k);
        }
        break;
    default:
        assert(0);
    }
}